

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O0

void testDWAQuantize(string *tempdir)

{
  float quantlevel;
  int i;
  int be;
  float baseErrors [9];
  int jpegQuantTableCbCrMin;
  int jpegQuantTableCbCr [64];
  int jpegQuantTableYMin;
  int jpegQuantTableY [64];
  int local_250;
  int local_24c;
  undefined1 local_248 [44];
  undefined4 local_21c;
  undefined1 local_218 [12];
  float in_stack_fffffffffffffdf4;
  undefined1 local_108 [264];
  
  memcpy(local_108,&DAT_001a4ec0,0x100);
  memcpy(local_218,&DAT_001a4fc0,0x100);
  local_21c = 0x11;
  memcpy(local_248,L"",0x24);
  for (local_24c = 0; local_24c < 9; local_24c = local_24c + 1) {
    for (local_250 = 0; local_250 < 0x40; local_250 = local_250 + 1) {
      testQuantizer(in_stack_fffffffffffffdf4);
      testQuantizer(in_stack_fffffffffffffdf4);
    }
  }
  testQuantizer(in_stack_fffffffffffffdf4);
  testQuantizer(in_stack_fffffffffffffdf4);
  testQuantizer(in_stack_fffffffffffffdf4);
  testQuantizer(in_stack_fffffffffffffdf4);
  testQuantizer(in_stack_fffffffffffffdf4);
  testQuantizer(in_stack_fffffffffffffdf4);
  testQuantizer(in_stack_fffffffffffffdf4);
  testQuantizer(in_stack_fffffffffffffdf4);
  testQuantizer(in_stack_fffffffffffffdf4);
  testQuantizer(in_stack_fffffffffffffdf4);
  testQuantizer(in_stack_fffffffffffffdf4);
  testQuantizer(in_stack_fffffffffffffdf4);
  return;
}

Assistant:

void testDWAQuantize (const std::string& tempdir)
{
    int jpegQuantTableY[] = {
        16, 11, 10, 16, 24,  40,  51,  61,  12, 12, 14, 19, 26,  58,  60,  55,
        14, 13, 16, 24, 40,  57,  69,  56,  14, 17, 22, 29, 51,  87,  80,  62,
        18, 22, 37, 56, 68,  109, 103, 77,  24, 35, 55, 64, 81,  104, 113, 92,
        49, 64, 78, 87, 103, 121, 120, 101, 72, 92, 95, 98, 112, 100, 103, 99};

    int jpegQuantTableYMin = 10;

    int jpegQuantTableCbCr[] = {
        17, 18, 24, 47, 99, 99, 99, 99, 18, 21, 26, 66, 99, 99, 99, 99,
        24, 26, 56, 99, 99, 99, 99, 99, 47, 66, 99, 99, 99, 99, 99, 99,
        99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99,
        99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99};

    int jpegQuantTableCbCrMin = 17;
//#define EXHAUSTING_TEST
#ifdef EXHAUSTING_TEST
    // the qscale is limited 0 - 100 in the set dwa compression level routine
    // in the library, so shouldn't have to test outside that range...
    for (float qscale = 0.f; qscale <= 100.f; qscale += 0.25f)
    {
        for ( int i = 0; i < 64; ++i )
        {
            // dwa encoder takes compression level and divides by 100000 to
            // get quantisation scale
            float quantlevel = qscale / 100000.f;

            testQuantizer (quantlevel * (float)(jpegQuantTableY[i]) / ((float)(jpegQuantTableYMin)));

            testQuantizer (quantlevel * (float)(jpegQuantTableCbCr[i]) / ((float)(jpegQuantTableCbCrMin)));
        }
    }
#else
    float baseErrors[] = { 0.f, 1.f, 20.f, 45.f /*default*/, 60.f, 73.f, 95.f, 100.f, 230.f };

    for ( int be = 0; be < static_cast<int> (sizeof(baseErrors)/sizeof(float)); ++be )
    {
        for ( int i = 0; i < 64; ++i )
        {
            // dwa encoder takes compression level and divides by 100000 to
            // get quantisation scale
            float quantlevel = baseErrors[be] / 100000.f;

            testQuantizer (quantlevel * (float)(jpegQuantTableY[i]) / ((float)(jpegQuantTableYMin)));

            testQuantizer (quantlevel * (float)(jpegQuantTableCbCr[i]) / ((float)(jpegQuantTableCbCrMin)));
        }
    }
    // particular edge cases previously
    testQuantizer (0.00048875);
    testQuantizer (0.00782075);
    testQuantizer (0.007821);
    testQuantizer (0.0078155);
    testQuantizer (0.00781375);
    testQuantizer (0.00782);
    testQuantizer (0.0078165);
    testQuantizer (0.0009765);
    testQuantizer (0.001244117622);
    testQuantizer (0.001747058821);
    testQuantizer (0.002620588057);
    testQuantizer (0.001080000075);
#endif
}